

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSurfaceStyle::~IfcSurfaceStyle(IfcSurfaceStyle *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  pointer psVar3;
  
  *(undefined8 *)&this[-1].field_0x60 = 0x88fc98;
  *(undefined8 *)&(this->super_IfcPresentationStyle).field_0x48 = 0x88fce8;
  (this->super_IfcPresentationStyle).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x88fcc0;
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::~vector((vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             *)&(this->super_IfcPresentationStyle).field_0x30);
  puVar2 = *(undefined1 **)
            &(this->super_IfcPresentationStyle).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcPresentationStyle).
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].field_0x60 = 0x88fd10;
  *(undefined8 *)&(this->super_IfcPresentationStyle).field_0x48 = 0x88fd38;
  psVar3 = this[-1].Styles.
           super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           .
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != (pointer)&this[-1].field_0x80) {
    operator_delete(psVar3,*(long *)&this[-1].field_0x80 + 1);
  }
  operator_delete(&this[-1].field_0x60,0x98);
  return;
}

Assistant:

IfcSurfaceStyle() : Object("IfcSurfaceStyle") {}